

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void pybind11::detail::loader_life_support::add_patient(handle h)

{
  loader_life_support *plVar1;
  cast_error *this;
  PyObject **ppPVar2;
  pair<std::__detail::_Node_iterator<_object_*,_true,_false>,_bool> pVar3;
  loader_life_support *frame;
  handle h_local;
  
  frame = (loader_life_support *)h.m_ptr;
  plVar1 = get_stack_top();
  if (plVar1 == (loader_life_support *)0x0) {
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error
              (this,
               "When called outside a bound function, py::cast() cannot do Python -> C++ conversions which require the creation of temporary values"
              );
    __cxa_throw(this,&cast_error::typeinfo,cast_error::~cast_error);
  }
  ppPVar2 = pybind11::handle::ptr((handle *)&frame);
  pVar3 = std::
          unordered_set<_object_*,_std::hash<_object_*>,_std::equal_to<_object_*>,_std::allocator<_object_*>_>
          ::insert(&plVar1->keep_alive,ppPVar2);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppPVar2 = pybind11::handle::ptr((handle *)&frame);
    ::_Py_INCREF(*ppPVar2);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE static void add_patient(handle h) {
        loader_life_support *frame = get_stack_top();
        if (!frame) {
            // NOTE: It would be nice to include the stack frames here, as this indicates
            // use of pybind11::cast<> outside the normal call framework, finding such
            // a location is challenging. Developers could consider printing out
            // stack frame addresses here using something like __builtin_frame_address(0)
            throw cast_error("When called outside a bound function, py::cast() cannot "
                             "do Python -> C++ conversions which require the creation "
                             "of temporary values");
        }

        if (frame->keep_alive.insert(h.ptr()).second)
            Py_INCREF(h.ptr());
    }